

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

NodePtr __thiscall dh::analysis::compound_stmt(analysis *this)

{
  undefined8 uVar1;
  TYPE TVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  analysis *in_RSI;
  bool bVar5;
  NodePtr NVar6;
  NodePtr tmp_in_ptr;
  NodePtr tmp_cur_ptr;
  NodePtr local_e8;
  undefined1 local_d8 [40];
  TreeNode *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  analysis *local_a0;
  const_iterator local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  char local_80 [16];
  string local_70;
  string local_50;
  
  local_d8._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  local_98._M_current = (token *)&this->current_tab;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,char_const(&)[3],int>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_98._M_current,(TreeNode **)this,
             (allocator<dh::TreeNode> *)&local_90,(char (*) [3])"{}",(int *)local_d8);
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_d8);
  local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
  local_a0 = this;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_d8);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"{","");
  match(in_RSI,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 != INT) {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != VOID) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != FLOAT) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != BOOLEAN) goto LAB_00112f9f;
      }
    }
  }
  var_decl((analysis *)local_d8);
  uVar1 = local_d8._8_8_;
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  _Var4._M_pi = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_d8._0_8_ = (TreeNode *)0x0;
  local_d8._8_8_ = (element_type *)0x0;
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  }
LAB_00112f9f:
  local_b0 = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8._M_pi =
       local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
LAB_00112fe0:
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 != INT) {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != VOID) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != FLOAT) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != BOOLEAN) goto LAB_00113056;
      }
    }
  }
  var_decl((analysis *)local_d8);
  TreeNode::setSibling(local_b0,(NodePtr *)local_d8);
  local_b0 = (TreeNode *)local_d8._0_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_a8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  goto LAB_00112fe0;
LAB_00113056:
  TreeNode::appendChild(*(TreeNode **)local_a0,&local_e8);
  _Var4._M_pi = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TreeNode *)0x0;
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
  }
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 != BREAK) {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != RETURN) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != IF) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != CONTINUE) {
          TVar2 = token::getType((in_RSI->tmp).
                                 super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (TVar2 != FOR) {
            TVar2 = token::getType((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            if (TVar2 != WHILE) {
              TVar2 = token::getType((in_RSI->tmp).
                                     super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
              if (TVar2 != ID) {
                token::getVal_abi_cxx11_
                          ((string *)local_d8,
                           (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
                iVar3 = std::__cxx11::string::compare(local_d8);
                if (iVar3 == 0) {
                  bVar5 = true;
                }
                else {
                  token::getVal_abi_cxx11_
                            ((string *)&local_90,
                             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  iVar3 = std::__cxx11::string::compare(local_90._M_local_buf);
                  bVar5 = iVar3 == 0;
                  if ((char *)local_90._M_allocated_capacity != local_80) {
                    operator_delete((void *)local_90._M_allocated_capacity);
                  }
                }
                if ((TreeNode *)local_d8._0_8_ != (TreeNode *)(local_d8 + 0x10)) {
                  operator_delete((void *)local_d8._0_8_);
                }
                if (!bVar5) goto LAB_00113195;
              }
            }
          }
        }
      }
    }
  }
  stmt((analysis *)local_d8);
  _Var4._M_pi = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_d8._0_8_;
  local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_;
  if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
  }
LAB_00113195:
  local_b0 = local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_a8,
             &local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  do {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != BREAK) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != RETURN) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != IF) {
          TVar2 = token::getType((in_RSI->tmp).
                                 super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (TVar2 != CONTINUE) {
            TVar2 = token::getType((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            if (TVar2 != FOR) {
              TVar2 = token::getType((in_RSI->tmp).
                                     super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
              if (TVar2 != WHILE) {
                TVar2 = token::getType((in_RSI->tmp).
                                       super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr);
                if (TVar2 != ID) {
                  token::getVal_abi_cxx11_
                            ((string *)local_d8,
                             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  iVar3 = std::__cxx11::string::compare((char *)local_d8);
                  if (iVar3 == 0) {
                    bVar5 = true;
                  }
                  else {
                    token::getVal_abi_cxx11_
                              ((string *)&local_90,
                               (in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                    iVar3 = std::__cxx11::string::compare(local_90._M_local_buf);
                    bVar5 = iVar3 == 0;
                    if ((char *)local_90._M_allocated_capacity != local_80) {
                      operator_delete((void *)local_90._M_allocated_capacity);
                    }
                  }
                  if ((TreeNode *)local_d8._0_8_ != (TreeNode *)(local_d8 + 0x10)) {
                    operator_delete((void *)local_d8._0_8_);
                  }
                  if (!bVar5) {
                    TreeNode::appendChild(*(TreeNode **)local_a0,&local_e8);
                    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"}","");
                    match(in_RSI,&local_70);
                    _Var4._M_pi = extraout_RDX;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p);
                      _Var4._M_pi = extraout_RDX_00;
                    }
                    if ((pointer)local_a8._M_pi != (pointer)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
                      _Var4._M_pi = extraout_RDX_01;
                    }
                    if (local_e8.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_e8.
                                 super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      _Var4._M_pi = extraout_RDX_02;
                    }
                    NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi = _Var4._M_pi;
                    NVar6.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                         (element_type *)local_a0;
                    return (NodePtr)NVar6.
                                    super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
                  }
                }
              }
            }
          }
        }
      }
    }
    stmt((analysis *)local_d8);
    TreeNode::setSibling(local_b0,(NodePtr *)local_d8);
    local_b0 = (TreeNode *)local_d8._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_a8,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    if ((element_type *)local_d8._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
  } while( true );
}

Assistant:

NodePtr analysis::compound_stmt()
{
#ifdef _DEBGU_
	::std::cout << "[DEBUG] in compound_stmt \n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("{}",tmp->getLineno());
	NodePtr tmp_ptr = nullptr;
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::ComK);

	match("{");

	if ( tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		tmp_ptr = var_decl();
	}

	NodePtr tmp_cur_ptr = tmp_ptr;
	while(tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		NodePtr tmp_in_ptr = var_decl();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	tmp_ptr = nullptr;
	if ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		tmp_ptr = stmt();
	}

	tmp_cur_ptr = tmp_ptr;
	while ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		NodePtr tmp_in_ptr = stmt();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	match("}");

	return ret;
}